

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O1

uint32_t __thiscall
RoboClaw::Read4_1(RoboClaw *this,uint8_t address,uint8_t cmd,uint8_t *status,bool *valid)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t *__nbytes;
  uint uVar13;
  void *__buf;
  void *__buf_00;
  char cVar14;
  uint uVar15;
  bool bVar16;
  ushort local_50;
  ushort local_48;
  
  if (valid != (bool *)0x0) {
    *valid = false;
  }
  local_48 = (ushort)address << 8;
  local_50 = (ushort)cmd << 8;
  cVar14 = '\x02';
  while( true ) {
    (*this->_vptr_RoboClaw[1])(this);
    this->m_crc = 0;
    (**this->_vptr_RoboClaw)(this,(ulong)address);
    uVar2 = this->m_crc ^ local_48;
    this->m_crc = uVar2;
    iVar6 = 8;
    do {
      uVar1 = uVar2 * 2;
      bVar16 = -1 < (short)uVar2;
      uVar2 = uVar1 ^ 0x1021;
      if (bVar16) {
        uVar2 = uVar1;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    this->m_crc = uVar2;
    (**this->_vptr_RoboClaw)(this,(ulong)cmd);
    uVar2 = this->m_crc ^ local_50;
    uVar13 = (uint)uVar2;
    this->m_crc = uVar2;
    uVar12 = 8;
    do {
      uVar15 = uVar13 * 2;
      sVar3 = (short)uVar13;
      uVar13 = uVar15 ^ 0x1021;
      if (-1 < sVar3) {
        uVar13 = uVar15;
      }
      uVar7 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar7;
    } while (uVar7 != 0);
    this->m_crc = (uint16_t)uVar13;
    sVar4 = read(this,this->m_timeout,(void *)(ulong)uVar15,uVar12);
    uVar15 = (uint)sVar4 & 0xff;
    uVar2 = (ushort)(uVar15 << 8) ^ this->m_crc;
    uVar13 = (uint)uVar2;
    this->m_crc = uVar2;
    uVar12 = 8;
    do {
      uVar7 = uVar13 * 2;
      sVar3 = (short)uVar13;
      uVar13 = uVar7 ^ 0x1021;
      if (-1 < sVar3) {
        uVar13 = uVar7;
      }
      uVar8 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar8;
    } while (uVar8 != 0);
    this->m_crc = (uint16_t)uVar13;
    sVar4 = read(this,this->m_timeout,(void *)(ulong)uVar7,uVar12);
    uVar7 = (uint)sVar4 & 0xff;
    uVar2 = (ushort)(uVar7 << 8) ^ this->m_crc;
    uVar13 = (uint)uVar2;
    this->m_crc = uVar2;
    uVar12 = 8;
    do {
      uVar8 = uVar13 * 2;
      sVar3 = (short)uVar13;
      uVar13 = uVar8 ^ 0x1021;
      if (-1 < sVar3) {
        uVar13 = uVar8;
      }
      uVar9 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar9;
    } while (uVar9 != 0);
    this->m_crc = (uint16_t)uVar13;
    sVar4 = read(this,this->m_timeout,(void *)(ulong)uVar8,uVar12);
    uVar8 = ((uint)sVar4 & 0xff) << 8;
    uVar2 = this->m_crc ^ (ushort)uVar8;
    uVar13 = (uint)uVar2;
    this->m_crc = uVar2;
    uVar12 = 8;
    do {
      uVar9 = uVar13 * 2;
      sVar3 = (short)uVar13;
      uVar13 = uVar9 ^ 0x1021;
      if (-1 < sVar3) {
        uVar13 = uVar9;
      }
      uVar10 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar10;
    } while (uVar10 != 0);
    this->m_crc = (uint16_t)uVar13;
    sVar4 = read(this,this->m_timeout,(void *)(ulong)uVar9,uVar12);
    uVar9 = (uint)sVar4 & 0xff;
    uVar2 = (ushort)(uVar9 << 8) ^ this->m_crc;
    uVar13 = (uint)uVar2;
    this->m_crc = uVar2;
    uVar12 = 8;
    do {
      uVar10 = uVar13 * 2;
      sVar3 = (short)uVar13;
      uVar13 = uVar10 ^ 0x1021;
      if (-1 < sVar3) {
        uVar13 = uVar10;
      }
      uVar11 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != 0);
    this->m_crc = (uint16_t)uVar13;
    sVar4 = read(this,this->m_timeout,(void *)(ulong)uVar10,uVar12);
    uVar2 = (ushort)(((uint)sVar4 & 0xff) << 8) ^ this->m_crc;
    this->m_crc = uVar2;
    __buf = (void *)0x8;
    do {
      uVar1 = uVar2 * 2;
      bVar16 = -1 < (short)uVar2;
      uVar2 = uVar1 ^ 0x1021;
      if (bVar16) {
        uVar2 = uVar1;
      }
      uVar13 = (int)__buf - 1;
      __buf = (void *)(ulong)uVar13;
    } while (uVar13 != 0);
    this->m_crc = uVar2;
    if (status != (uint8_t *)0x0) {
      *status = (uint8_t)sVar4;
    }
    __nbytes = status;
    sVar4 = read(this,this->m_timeout,__buf,(size_t)status);
    sVar5 = read(this,this->m_timeout,__buf_00,(size_t)__nbytes);
    if ((((uint)sVar4 & 0xff) << 8 | (uint)sVar5 & 0xff) == (uint)this->m_crc) break;
    bVar16 = cVar14 == '\0';
    cVar14 = cVar14 + -1;
    if (bVar16) {
      return 0;
    }
  }
  *valid = true;
  return uVar8 | uVar7 << 0x10 | uVar15 << 0x18 | uVar9;
}

Assistant:

uint32_t RoboClaw::Read4_1( uint8_t address, uint8_t cmd, uint8_t *status, bool *valid)
{
    uint8_t crc;

    if(valid)
        *valid = false;

    uint32_t value=0;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( address );
        crc_update( address );
        write(cmd);
        crc_update(cmd);

        data = read( m_timeout );
        crc_update(data);
        value=(uint32_t)data<<24;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<16;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<8;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            if(status)
                *status = data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        *valid = true;
                        return value;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}